

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_aead128a_enc.c
# Opt level: O2

void test_aead128a_encryption(void)

{
  uint8_t *nonce;
  uint8_t *__s2;
  uint8_t *puVar1;
  int iVar2;
  vecs_err_t vVar3;
  unsigned_long_long atto_idx;
  size_t sVar4;
  size_t sVar5;
  size_t sVar6;
  byte bVar7;
  undefined8 uVar8;
  byte bVar9;
  long lVar10;
  long lVar11;
  uint8_t *puVar12;
  ulong uVar13;
  undefined1 auVar14 [32];
  undefined1 in_ZMM0 [64];
  undefined8 uStackY_1d0;
  uint8_t obtained_ciphertext [1];
  undefined1 auStack_1a7 [15];
  uint8_t obtained_tag [16];
  vecs_aead_t testcase;
  uint8_t obtained_tag_3 [16];
  uint8_t obtained_ciphertext_4 [48];
  byte local_50;
  
  auVar14 = in_ZMM0._0_32_;
  puts("Testing Ascon-128a encryption...");
  testcase._0_32_ = vpcmpeqd_avx2(auVar14,auVar14);
  testcase._64_24_ = testcase._8_24_;
  testcase._32_24_ = testcase._0_24_;
  testcase.plaintext._16_8_ = testcase.count;
  ascon_aead_cleanup((ascon_aead_ctx_t *)&testcase);
  lVar10 = 0;
  do {
    if (lVar10 == 0x58) goto LAB_0010f48e;
    lVar11 = lVar10 + -0x28;
    lVar10 = lVar10 + 1;
  } while (testcase.plaintext[lVar11] == '\0');
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,0x16,"test_aead_cleanup",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010f48e:
  memcpy(&testcase,&DAT_001212e0,0xd0);
  obtained_ciphertext[0] = '\0';
  obtained_tag[0] = '\0';
  obtained_tag[1] = '\0';
  obtained_tag[2] = '\0';
  obtained_tag[3] = '\0';
  obtained_tag[4] = '\0';
  obtained_tag[5] = '\0';
  obtained_tag[6] = '\0';
  obtained_tag[7] = '\0';
  obtained_tag[8] = '\0';
  obtained_tag[9] = '\0';
  obtained_tag[10] = '\0';
  obtained_tag[0xb] = '\0';
  obtained_tag[0xc] = '\0';
  obtained_tag[0xd] = '\0';
  obtained_tag[0xe] = '\0';
  obtained_tag[0xf] = '\0';
  puVar12 = testcase.key;
  nonce = testcase.nonce;
  ascon_aead128a_encrypt
            (obtained_ciphertext,obtained_tag,puVar12,nonce,testcase.assoc_data,testcase.plaintext,0
             ,0,0x10);
  vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,testcase.ciphertext_len);
  __s2 = testcase.ciphertext;
  iVar2 = bcmp(obtained_ciphertext,__s2,testcase.ciphertext_len);
  if (iVar2 == 0) {
    if (obtained_tag == testcase.tag) {
      obtained_ciphertext[0] = '\0';
      obtained_tag[0] = '\0';
      obtained_tag[1] = '\0';
      obtained_tag[2] = '\0';
      obtained_tag[3] = '\0';
      obtained_tag[4] = '\0';
      obtained_tag[5] = '\0';
      obtained_tag[6] = '\0';
      obtained_tag[7] = '\0';
      obtained_tag[8] = '\0';
      obtained_tag[9] = '\0';
      obtained_tag[10] = '\0';
      obtained_tag[0xb] = '\0';
      obtained_tag[0xc] = '\0';
      obtained_tag[0xd] = '\0';
      obtained_tag[0xe] = '\0';
      obtained_tag[0xf] = '\0';
      ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,puVar12,nonce);
      if (local_50 == 0) {
        sVar4 = ascon_aead128a_encrypt_final
                          ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                           obtained_tag,0x10);
        vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,testcase.ciphertext_len);
        if (sVar4 == 0) {
          iVar2 = bcmp(obtained_ciphertext,__s2,testcase.ciphertext_len);
          if (iVar2 == 0) {
            if (obtained_tag == testcase.tag) {
              lVar10 = 0;
              uStackY_1d0 = 0x56;
              do {
                if (lVar10 == 0x58) {
                  obtained_ciphertext[0] = '\0';
                  obtained_tag[0] = '\0';
                  obtained_tag[1] = '\0';
                  obtained_tag[2] = '\0';
                  obtained_tag[3] = '\0';
                  obtained_tag[4] = '\0';
                  obtained_tag[5] = '\0';
                  obtained_tag[6] = '\0';
                  obtained_tag[7] = '\0';
                  obtained_tag[8] = '\0';
                  obtained_tag[9] = '\0';
                  obtained_tag[10] = '\0';
                  obtained_tag[0xb] = '\0';
                  obtained_tag[0xc] = '\0';
                  obtained_tag[0xd] = '\0';
                  obtained_tag[0xe] = '\0';
                  obtained_tag[0xf] = '\0';
                  ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,puVar12,nonce);
                  ascon_aead128a_assoc_data_update
                            ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,0);
                  ascon_aead128a_assoc_data_update
                            ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,0);
                  ascon_aead128a_assoc_data_update
                            ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,0);
                  sVar4 = ascon_aead128a_encrypt_final
                                    ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                                     obtained_tag,0x10);
                  vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,
                                    testcase.ciphertext_len);
                  if (sVar4 == 0) {
                    iVar2 = bcmp(obtained_ciphertext,__s2,testcase.ciphertext_len);
                    if (iVar2 == 0) {
                      if (obtained_tag == testcase.tag) {
                        lVar10 = 0;
                        uStackY_1d0 = 0x69;
                        goto LAB_00110abc;
                      }
                      uStackY_1d0 = 0x68;
                    }
                    else {
                      uStackY_1d0 = 0x67;
                    }
                  }
                  else {
                    uStackY_1d0 = 100;
                  }
                  break;
                }
                puVar1 = obtained_ciphertext_4 + lVar10;
                lVar10 = lVar10 + 1;
              } while (*puVar1 == '\0');
            }
            else {
              uStackY_1d0 = 0x55;
            }
          }
          else {
            uStackY_1d0 = 0x54;
          }
        }
        else {
          uStackY_1d0 = 0x51;
        }
      }
      else {
        uStackY_1d0 = 0x4a;
      }
    }
    else {
      uStackY_1d0 = 0x44;
    }
  }
  else {
    uStackY_1d0 = 0x43;
  }
  goto LAB_0010f5fa;
  while (puVar1 = obtained_ciphertext_4 + lVar10, lVar10 = lVar10 + 1, *puVar1 == '\0') {
LAB_00110abc:
    if (lVar10 == 0x58) {
      obtained_ciphertext[0] = '\0';
      obtained_tag[0] = '\0';
      obtained_tag[1] = '\0';
      obtained_tag[2] = '\0';
      obtained_tag[3] = '\0';
      obtained_tag[4] = '\0';
      obtained_tag[5] = '\0';
      obtained_tag[6] = '\0';
      obtained_tag[7] = '\0';
      obtained_tag[8] = '\0';
      obtained_tag[9] = '\0';
      obtained_tag[10] = '\0';
      obtained_tag[0xb] = '\0';
      obtained_tag[0xc] = '\0';
      obtained_tag[0xd] = '\0';
      obtained_tag[0xe] = '\0';
      obtained_tag[0xf] = '\0';
      ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,puVar12,nonce);
      sVar4 = ascon_aead128a_encrypt_update
                        ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,(uint8_t *)0x0,0);
      if (sVar4 == 0) {
        sVar4 = ascon_aead128a_encrypt_update
                          ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,
                           obtained_ciphertext,0);
        if (sVar4 == 0) {
          sVar4 = ascon_aead128a_encrypt_update
                            ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,
                             obtained_ciphertext,0);
          if (sVar4 == 0) {
            sVar4 = ascon_aead128a_encrypt_update
                              ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                               obtained_ciphertext,0);
            if (sVar4 == 0) {
              sVar4 = ascon_aead128a_encrypt_final
                                ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                                 obtained_tag,0x10);
              vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,testcase.ciphertext_len);
              if (sVar4 == 0) {
                iVar2 = bcmp(obtained_ciphertext,__s2,testcase.ciphertext_len);
                uStackY_1d0 = 0x81;
                if ((iVar2 == 0) && (uStackY_1d0 = 0x82, obtained_tag == testcase.tag)) {
                  lVar10 = 0;
                  uStackY_1d0 = 0x83;
                  goto LAB_00110c07;
                }
              }
              else {
                uStackY_1d0 = 0x7f;
              }
            }
            else {
              uStackY_1d0 = 0x79;
            }
          }
          else {
            uStackY_1d0 = 0x76;
          }
        }
        else {
          uStackY_1d0 = 0x73;
        }
      }
      else {
        uStackY_1d0 = 0x70;
      }
      break;
    }
  }
  goto LAB_0010f5fa;
  while (puVar1 = obtained_ciphertext_4 + lVar10, lVar10 = lVar10 + 1, *puVar1 == '\0') {
LAB_00110c07:
    if (lVar10 == 0x58) {
      obtained_ciphertext[0] = '\0';
      obtained_tag[0] = '\0';
      obtained_tag[1] = '\0';
      obtained_tag[2] = '\0';
      obtained_tag[3] = '\0';
      obtained_tag[4] = '\0';
      obtained_tag[5] = '\0';
      obtained_tag[6] = '\0';
      obtained_tag[7] = '\0';
      obtained_tag[8] = '\0';
      obtained_tag[9] = '\0';
      obtained_tag[10] = '\0';
      obtained_tag[0xb] = '\0';
      obtained_tag[0xc] = '\0';
      obtained_tag[0xd] = '\0';
      obtained_tag[0xe] = '\0';
      obtained_tag[0xf] = '\0';
      ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,puVar12,nonce);
      ascon_aead128a_assoc_data_update((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,0);
      ascon_aead128a_assoc_data_update
                ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,0);
      ascon_aead128a_assoc_data_update((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,0);
      sVar4 = ascon_aead128a_encrypt_update
                        ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,(uint8_t *)0x0,0);
      uStackY_1d0 = 0x8d;
      if (sVar4 == 0) {
        sVar4 = ascon_aead128a_encrypt_update
                          ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,
                           obtained_ciphertext,0);
        uStackY_1d0 = 0x90;
        if (sVar4 == 0) {
          sVar4 = ascon_aead128a_encrypt_update
                            ((ascon_aead_ctx_t *)obtained_ciphertext_4,(uint8_t *)0x0,
                             obtained_ciphertext,0);
          uStackY_1d0 = 0x93;
          if (sVar4 == 0) {
            sVar4 = ascon_aead128a_encrypt_update
                              ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                               obtained_ciphertext,0);
            uStackY_1d0 = 0x96;
            if (sVar4 == 0) {
              sVar4 = ascon_aead128a_encrypt_final
                                ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                                 obtained_tag,0x10);
              vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,testcase.ciphertext_len);
              uStackY_1d0 = 0x9c;
              if (sVar4 == 0) {
                iVar2 = bcmp(obtained_ciphertext,__s2,testcase.ciphertext_len);
                uStackY_1d0 = 0x9e;
                if ((iVar2 == 0) && (uStackY_1d0 = 0x9f, obtained_tag == testcase.tag)) {
                  lVar10 = 0;
                  uStackY_1d0 = 0xa0;
                  goto LAB_00110d84;
                }
              }
            }
          }
        }
      }
      break;
    }
  }
  goto LAB_0010f5fa;
  while (puVar12 = obtained_ciphertext_4 + lVar10, lVar10 = lVar10 + 1, *puVar12 == '\0') {
LAB_0010f817:
    if (lVar10 == 0x58) goto LAB_0010f85b;
  }
  goto LAB_0010f82b;
  while (puVar12 = obtained_ciphertext_4 + lVar10, lVar10 = lVar10 + 1, *puVar12 == '\0') {
LAB_0010fa7d:
    if (lVar10 == 0x58) goto LAB_0010fac1;
  }
  goto LAB_0010fa91;
  while (puVar12 = obtained_ciphertext_4 + lVar10, lVar10 = lVar10 + 1, *puVar12 == '\0') {
LAB_00110d84:
    if (lVar10 == 0x58) goto LAB_0010f62a;
  }
LAB_0010f5fa:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uStackY_1d0,"test_encrypt_empty",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010f62a:
  memcpy(&testcase,&DAT_001213b0,0xd0);
  obtained_ciphertext[0] = '\0';
  obtained_tag[0] = '\0';
  obtained_tag[1] = '\0';
  obtained_tag[2] = '\0';
  obtained_tag[3] = '\0';
  obtained_tag[4] = '\0';
  obtained_tag[5] = '\0';
  obtained_tag[6] = '\0';
  obtained_tag[7] = '\0';
  obtained_tag[8] = '\0';
  obtained_tag[9] = '\0';
  obtained_tag[10] = '\0';
  obtained_tag[0xb] = '\0';
  obtained_tag[0xc] = '\0';
  obtained_tag[0xd] = '\0';
  obtained_tag[0xe] = '\0';
  obtained_tag[0xf] = '\0';
  ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce);
  ascon_aead128a_assoc_data_update
            ((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.assoc_data,testcase.assoc_data_len);
  sVar4 = ascon_aead128a_encrypt_final
                    ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,obtained_tag,0x10
                    );
  vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,testcase.ciphertext_len);
  uVar8 = 0xcc;
  if (sVar4 == 0) {
    iVar2 = bcmp(obtained_ciphertext,testcase.ciphertext,testcase.ciphertext_len);
    uVar8 = 0xce;
    if ((iVar2 == 0) && (uVar8 = 0xcf, obtained_tag == testcase.tag)) {
      lVar10 = 0;
      uVar8 = 0xd0;
      do {
        if (lVar10 == 0x58) {
          obtained_ciphertext[0] = '\0';
          obtained_tag[0] = '\0';
          obtained_tag[1] = '\0';
          obtained_tag[2] = '\0';
          obtained_tag[3] = '\0';
          obtained_tag[4] = '\0';
          obtained_tag[5] = '\0';
          obtained_tag[6] = '\0';
          obtained_tag[7] = '\0';
          obtained_tag[8] = '\0';
          obtained_tag[9] = '\0';
          obtained_tag[10] = '\0';
          obtained_tag[0xb] = '\0';
          obtained_tag[0xc] = '\0';
          obtained_tag[0xd] = '\0';
          obtained_tag[0xe] = '\0';
          obtained_tag[0xf] = '\0';
          ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce)
          ;
          ascon_aead128a_assoc_data_update
                    ((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.assoc_data,
                     testcase.assoc_data_len);
          sVar4 = ascon_aead128a_encrypt_update
                            ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                             testcase.plaintext,testcase.plaintext_len);
          uVar8 = 0xdb;
          if (sVar4 == 0) {
            sVar4 = ascon_aead128a_encrypt_final
                              ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_ciphertext,
                               obtained_tag,0x10);
            vecs_aead_enc_log(&testcase,obtained_ciphertext,obtained_tag,testcase.ciphertext_len);
            uVar8 = 0xe1;
            if (sVar4 == 0) {
              iVar2 = bcmp(obtained_ciphertext,testcase.ciphertext,testcase.ciphertext_len);
              uVar8 = 0xe4;
              if ((iVar2 == 0) && (uVar8 = 0xe5, obtained_tag == testcase.tag)) {
                lVar10 = 0;
                uVar8 = 0xe6;
                goto LAB_0010f817;
              }
            }
          }
          break;
        }
        puVar12 = obtained_ciphertext_4 + lVar10;
        lVar10 = lVar10 + 1;
      } while (*puVar12 == '\0');
    }
  }
LAB_0010f82b:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar8,"test_encrypt_1_byte_ad_empty_pt",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010f85b:
  memcpy(&testcase,&DAT_00121480,0xd0);
  obtained_tag = (uint8_t  [16])ZEXT816(0);
  _obtained_ciphertext = (FILE *)0x0;
  auStack_1a7._7_8_ = 0;
  ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce);
  sVar4 = ascon_aead128a_encrypt_update
                    ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag,testcase.plaintext,
                     testcase.plaintext_len);
  uVar8 = 0x10e;
  if (sVar4 == 0) {
    sVar4 = ascon_aead128a_encrypt_final
                      ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag,obtained_ciphertext,
                       0x10);
    vecs_aead_enc_log(&testcase,obtained_tag,obtained_ciphertext,testcase.ciphertext_len);
    uVar8 = 0x114;
    if (sVar4 == 1) {
      iVar2 = bcmp(obtained_tag,testcase.ciphertext,testcase.ciphertext_len);
      uVar8 = 0x116;
      if ((iVar2 == 0) && (uVar8 = 0x117, _obtained_ciphertext == (vecs_ctx_t)testcase.tag)) {
        lVar10 = 0;
        uVar8 = 0x118;
        do {
          if (lVar10 == 0x58) {
            obtained_tag = (uint8_t  [16])ZEXT816(0);
            _obtained_ciphertext = (FILE *)0x0;
            auStack_1a7._7_8_ = 0;
            ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,
                                testcase.nonce);
            ascon_aead128a_assoc_data_update
                      ((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.assoc_data,
                       testcase.assoc_data_len);
            sVar4 = ascon_aead128a_encrypt_update
                              ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag,
                               testcase.plaintext,testcase.plaintext_len);
            uVar8 = 0x123;
            if (sVar4 == 0) {
              sVar4 = ascon_aead128a_encrypt_final
                                ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag,
                                 obtained_ciphertext,0x10);
              vecs_aead_enc_log(&testcase,obtained_tag,obtained_ciphertext,testcase.ciphertext_len);
              uVar8 = 0x129;
              if (sVar4 == 1) {
                iVar2 = bcmp(obtained_tag,testcase.ciphertext,testcase.ciphertext_len);
                uVar8 = 300;
                if ((iVar2 == 0) &&
                   (uVar8 = 0x12d, _obtained_ciphertext == (vecs_ctx_t)testcase.tag)) {
                  lVar10 = 0;
                  uVar8 = 0x12e;
                  goto LAB_0010fa7d;
                }
              }
            }
            break;
          }
          puVar12 = obtained_ciphertext_4 + lVar10;
          lVar10 = lVar10 + 1;
        } while (*puVar12 == '\0');
      }
    }
  }
LAB_0010fa91:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar8,"test_encrypt_1_byte_pt_empty_ad",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010fac1:
  memcpy(&testcase,&DAT_00121550,0xd0);
  obtained_tag = (uint8_t  [16])ZEXT816(0);
  _obtained_ciphertext = (FILE *)0x0;
  auStack_1a7._7_8_ = 0;
  ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce);
  ascon_aead128a_assoc_data_update
            ((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.assoc_data,testcase.assoc_data_len);
  sVar4 = ascon_aead128a_encrypt_update
                    ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag,testcase.plaintext,
                     testcase.plaintext_len);
  uVar8 = 0x157;
  if (sVar4 == 0) {
    sVar4 = ascon_aead128a_encrypt_final
                      ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag,obtained_ciphertext,
                       0x10);
    vecs_aead_enc_log(&testcase,obtained_tag,obtained_ciphertext,testcase.ciphertext_len);
    uVar8 = 0x15d;
    if (sVar4 == 1) {
      iVar2 = bcmp(obtained_tag,testcase.ciphertext,testcase.ciphertext_len);
      uVar8 = 0x160;
      if (iVar2 == 0) {
        lVar10 = 0;
        do {
          if (lVar10 == 0x58) goto LAB_0010fbf7;
          puVar12 = obtained_ciphertext_4 + lVar10;
          lVar10 = lVar10 + 1;
        } while (*puVar12 == '\0');
        uVar8 = 0x161;
      }
    }
  }
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar8,"test_encrypt_1_byte_pt_1_byte_ad",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010fbf7:
  vVar3 = vecs_init((vecs_ctx_t *)obtained_tag,"vectors/aead128a.txt",0x10);
  if (vVar3 == VECS_OK) {
    do {
      vVar3 = vecs_aead_next((vecs_ctx_t *)obtained_tag,&testcase);
      if (vVar3 == VECS_EOF) goto LAB_0010fc48;
      atto_counter = testcase.count;
      if (vVar3 != VECS_OK) {
        uVar8 = 0x175;
        goto LAB_0010fc37;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uVar8 = 0x176;
        goto LAB_0010fc37;
      }
      obtained_ciphertext_4[0x20] = '\0';
      obtained_ciphertext_4[0x21] = '\0';
      obtained_ciphertext_4[0x22] = '\0';
      obtained_ciphertext_4[0x23] = '\0';
      obtained_ciphertext_4[0x24] = '\0';
      obtained_ciphertext_4[0x25] = '\0';
      obtained_ciphertext_4[0x26] = '\0';
      obtained_ciphertext_4[0x27] = '\0';
      obtained_ciphertext_4[0x28] = '\0';
      obtained_ciphertext_4[0x29] = '\0';
      obtained_ciphertext_4[0x2a] = '\0';
      obtained_ciphertext_4[0x2b] = '\0';
      obtained_ciphertext_4[0x2c] = '\0';
      obtained_ciphertext_4[0x2d] = '\0';
      obtained_ciphertext_4[0x2e] = '\0';
      obtained_ciphertext_4[0x2f] = '\0';
      obtained_ciphertext_4[0] = '\0';
      obtained_ciphertext_4[1] = '\0';
      obtained_ciphertext_4[2] = '\0';
      obtained_ciphertext_4[3] = '\0';
      obtained_ciphertext_4[4] = '\0';
      obtained_ciphertext_4[5] = '\0';
      obtained_ciphertext_4[6] = '\0';
      obtained_ciphertext_4[7] = '\0';
      obtained_ciphertext_4[8] = '\0';
      obtained_ciphertext_4[9] = '\0';
      obtained_ciphertext_4[10] = '\0';
      obtained_ciphertext_4[0xb] = '\0';
      obtained_ciphertext_4[0xc] = '\0';
      obtained_ciphertext_4[0xd] = '\0';
      obtained_ciphertext_4[0xe] = '\0';
      obtained_ciphertext_4[0xf] = '\0';
      obtained_ciphertext_4[0x10] = '\0';
      obtained_ciphertext_4[0x11] = '\0';
      obtained_ciphertext_4[0x12] = '\0';
      obtained_ciphertext_4[0x13] = '\0';
      obtained_ciphertext_4[0x14] = '\0';
      obtained_ciphertext_4[0x15] = '\0';
      obtained_ciphertext_4[0x16] = '\0';
      obtained_ciphertext_4[0x17] = '\0';
      obtained_ciphertext_4[0x18] = '\0';
      obtained_ciphertext_4[0x19] = '\0';
      obtained_ciphertext_4[0x1a] = '\0';
      obtained_ciphertext_4[0x1b] = '\0';
      obtained_ciphertext_4[0x1c] = '\0';
      obtained_ciphertext_4[0x1d] = '\0';
      obtained_ciphertext_4[0x1e] = '\0';
      obtained_ciphertext_4[0x1f] = '\0';
      _obtained_ciphertext = (FILE *)0x0;
      auStack_1a7._7_8_ = 0;
      ascon_aead128a_encrypt
                (obtained_ciphertext_4,obtained_ciphertext,testcase.key,testcase.nonce,
                 testcase.assoc_data,testcase.plaintext,testcase.assoc_data_len,
                 testcase.plaintext_len,0x10);
      vecs_aead_enc_log(&testcase,obtained_ciphertext_4,obtained_ciphertext,testcase.ciphertext_len)
      ;
      iVar2 = bcmp(obtained_ciphertext_4,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar2 != 0) {
        uVar8 = 0x186;
        goto LAB_0010fc37;
      }
    } while (_obtained_ciphertext == (vecs_ctx_t)testcase.tag);
    uVar8 = 0x187;
  }
  else {
    uVar8 = 0x16b;
  }
LAB_0010fc37:
  printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
         "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
         ,uVar8,"test_encrypt_offline",atto_counter);
  atto_at_least_one_fail = '\x01';
LAB_0010fc48:
  vVar3 = vecs_init((vecs_ctx_t *)obtained_ciphertext,"vectors/aead128a.txt",0x10);
  if (vVar3 == VECS_OK) {
    while( true ) {
      puVar12 = testcase.assoc_data;
      vVar3 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,&testcase);
      if (vVar3 == VECS_EOF) break;
      atto_counter = testcase.count;
      if (vVar3 != VECS_OK) {
        uVar8 = 0x19f;
LAB_00110024:
        printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
               ,uVar8,"test_encrypt_update_single_byte",atto_counter);
LAB_00110110:
        atto_at_least_one_fail = '\x01';
        break;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uVar8 = 0x1a0;
        goto LAB_00110024;
      }
      obtained_tag = (uint8_t  [16])ZEXT816(0);
      obtained_tag_3[0] = '\0';
      obtained_tag_3[1] = '\0';
      obtained_tag_3[2] = '\0';
      obtained_tag_3[3] = '\0';
      obtained_tag_3[4] = '\0';
      obtained_tag_3[5] = '\0';
      obtained_tag_3[6] = '\0';
      obtained_tag_3[7] = '\0';
      obtained_tag_3[8] = '\0';
      obtained_tag_3[9] = '\0';
      obtained_tag_3[10] = '\0';
      obtained_tag_3[0xb] = '\0';
      obtained_tag_3[0xc] = '\0';
      obtained_tag_3[0xd] = '\0';
      obtained_tag_3[0xe] = '\0';
      obtained_tag_3[0xf] = '\0';
      ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce);
      uVar13 = 0;
      bVar9 = 1;
      while (uVar13 < testcase.assoc_data_len) {
        ascon_aead128a_assoc_data_update((ascon_aead_ctx_t *)obtained_ciphertext_4,puVar12,1);
        uVar13 = uVar13 + 1;
        bVar7 = bVar9 & 0xf;
        bVar9 = bVar9 + 1;
        puVar12 = puVar12 + 1;
        if (bVar7 != local_50) {
          uVar8 = 0x1aa;
          goto LAB_00110024;
        }
      }
      puVar12 = testcase.plaintext;
      lVar10 = 0;
      uVar13 = 0;
      bVar9 = 1;
      while( true ) {
        if (testcase.plaintext_len <= uVar13) break;
        sVar4 = ascon_aead128a_encrypt_update
                          ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag + lVar10,puVar12,1
                          );
        if ((bVar9 & 0xf) != local_50) {
          uVar8 = 0x1b5;
          goto LAB_00110101;
        }
        if (local_50 == 0) {
          if (sVar4 != 0x10) {
            uVar8 = 0x1b8;
            goto LAB_00110101;
          }
        }
        else if (sVar4 != 0) {
          uVar8 = 0x1bc;
          goto LAB_00110101;
        }
        lVar10 = lVar10 + sVar4;
        bVar9 = bVar9 + 1;
        puVar12 = puVar12 + 1;
        uVar13 = uVar13 + 1;
      }
      sVar4 = ascon_aead128a_encrypt_final
                        ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag + lVar10,
                         obtained_tag_3,0x10);
      if (0xf < sVar4) {
        uVar8 = 0x1c4;
LAB_00110101:
        printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
               ,uVar8,"test_encrypt_update_single_byte",atto_counter);
        goto LAB_00110110;
      }
      if (sVar4 != ((uint)testcase.ciphertext_len & 0xf)) {
        uVar8 = 0x1c5;
        goto LAB_00110101;
      }
      if (sVar4 + lVar10 != testcase.ciphertext_len) {
        uVar8 = 0x1c6;
        goto LAB_00110101;
      }
      vecs_aead_enc_log(&testcase,obtained_tag,obtained_tag_3,sVar4 + lVar10);
      iVar2 = bcmp(obtained_tag,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar2 != 0) {
        uVar8 = 0x1cb;
        goto LAB_00110024;
      }
      if (obtained_tag_3 != testcase.tag) {
        uVar8 = 0x1cc;
        goto LAB_00110024;
      }
      lVar10 = 0;
      while (lVar10 != 0x58) {
        puVar12 = obtained_ciphertext_4 + lVar10;
        lVar10 = lVar10 + 1;
        if (*puVar12 != '\0') {
          uVar8 = 0x1cd;
          goto LAB_00110024;
        }
      }
    }
  }
  else {
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,0x192,"test_encrypt_update_single_byte",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  vVar3 = vecs_init((vecs_ctx_t *)obtained_ciphertext,"vectors/aead128a.txt",0x10);
  if (vVar3 == VECS_OK) {
    while( true ) {
      vVar3 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,&testcase);
      if (vVar3 == VECS_EOF) break;
      atto_counter = testcase.count;
      if (vVar3 != VECS_OK) {
        uVar8 = 0x1e6;
        goto LAB_001103b7;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uVar8 = 0x1e7;
        goto LAB_001103b7;
      }
      obtained_tag = (uint8_t  [16])ZEXT816(0);
      obtained_tag_3[0] = '\0';
      obtained_tag_3[1] = '\0';
      obtained_tag_3[2] = '\0';
      obtained_tag_3[3] = '\0';
      obtained_tag_3[4] = '\0';
      obtained_tag_3[5] = '\0';
      obtained_tag_3[6] = '\0';
      obtained_tag_3[7] = '\0';
      obtained_tag_3[8] = '\0';
      obtained_tag_3[9] = '\0';
      obtained_tag_3[10] = '\0';
      obtained_tag_3[0xb] = '\0';
      obtained_tag_3[0xc] = '\0';
      obtained_tag_3[0xd] = '\0';
      obtained_tag_3[0xe] = '\0';
      obtained_tag_3[0xf] = '\0';
      ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce);
      lVar10 = 0;
      sVar4 = testcase.assoc_data_len;
      while (sVar4 != 0) {
        sVar6 = 3;
        if (sVar4 < 3) {
          sVar6 = sVar4;
        }
        ascon_aead128a_assoc_data_update
                  ((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.assoc_data + lVar10,sVar6);
        lVar10 = lVar10 + sVar6;
        sVar4 = sVar4 - sVar6;
        if (((uint)lVar10 & 0xf) != (uint)local_50) {
          uVar8 = 0x1f7;
          goto LAB_001103b7;
        }
      }
      lVar10 = 0;
      lVar11 = 0;
      bVar9 = 0;
      for (sVar4 = testcase.plaintext_len; sVar4 != 0; sVar4 = sVar4 - sVar6) {
        sVar6 = 3;
        if (sVar4 < 3) {
          sVar6 = sVar4;
        }
        sVar5 = ascon_aead128a_encrypt_update
                          ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag + lVar10,
                           testcase.plaintext + lVar11,sVar6);
        lVar11 = lVar11 + sVar6;
        if (((uint)lVar11 & 0xf) != (uint)local_50) {
          uVar8 = 0x208;
          goto LAB_001106f3;
        }
        if (local_50 < bVar9) {
          if (sVar5 != 0x10) {
            uVar8 = 0x20b;
            goto LAB_001106f3;
          }
        }
        else if (sVar5 != 0) {
          uVar8 = 0x20f;
          goto LAB_001106f3;
        }
        lVar10 = lVar10 + sVar5;
        bVar9 = local_50;
      }
      sVar4 = ascon_aead128a_encrypt_final
                        ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag + lVar10,
                         obtained_tag_3,0x10);
      if (0xf < sVar4) {
        uVar8 = 0x21a;
LAB_001106f3:
        printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
               "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
               ,uVar8,"test_encrypt_update_three_bytes",atto_counter);
        goto LAB_001103be;
      }
      if (sVar4 != ((uint)testcase.ciphertext_len & 0xf)) {
        uVar8 = 0x21b;
        goto LAB_001106f3;
      }
      if (sVar4 + lVar10 != testcase.ciphertext_len) {
        uVar8 = 0x21c;
        goto LAB_001106f3;
      }
      vecs_aead_enc_log(&testcase,obtained_tag,obtained_tag_3,sVar4 + lVar10);
      iVar2 = bcmp(obtained_tag,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar2 != 0) {
        uVar8 = 0x221;
        goto LAB_001103b7;
      }
      if (obtained_tag_3 != testcase.tag) {
        uVar8 = 0x222;
        goto LAB_001103b7;
      }
      lVar10 = 0;
      while (lVar10 != 0x58) {
        puVar12 = obtained_ciphertext_4 + lVar10;
        lVar10 = lVar10 + 1;
        if (*puVar12 != '\0') {
          uVar8 = 0x223;
          goto LAB_001103b7;
        }
      }
    }
  }
  else {
    uVar8 = 0x1d9;
LAB_001103b7:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar8,"test_encrypt_update_three_bytes",atto_counter);
LAB_001103be:
    atto_at_least_one_fail = '\x01';
  }
  vVar3 = vecs_init((vecs_ctx_t *)obtained_ciphertext,"vectors/aead128a.txt",0x10);
  if (vVar3 == VECS_OK) {
    while( true ) {
      vVar3 = vecs_aead_next((vecs_ctx_t *)obtained_ciphertext,&testcase);
      if (vVar3 == VECS_EOF) break;
      atto_counter = testcase.count;
      if (vVar3 != VECS_OK) {
        uVar8 = 0x23c;
        goto LAB_00110660;
      }
      if (testcase.plaintext_len != testcase.ciphertext_len) {
        uVar8 = 0x23d;
        goto LAB_00110660;
      }
      obtained_tag = (uint8_t  [16])ZEXT816(0);
      obtained_tag_3[0] = '\0';
      obtained_tag_3[1] = '\0';
      obtained_tag_3[2] = '\0';
      obtained_tag_3[3] = '\0';
      obtained_tag_3[4] = '\0';
      obtained_tag_3[5] = '\0';
      obtained_tag_3[6] = '\0';
      obtained_tag_3[7] = '\0';
      obtained_tag_3[8] = '\0';
      obtained_tag_3[9] = '\0';
      obtained_tag_3[10] = '\0';
      obtained_tag_3[0xb] = '\0';
      obtained_tag_3[0xc] = '\0';
      obtained_tag_3[0xd] = '\0';
      obtained_tag_3[0xe] = '\0';
      obtained_tag_3[0xf] = '\0';
      ascon_aead128a_init((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.key,testcase.nonce);
      uVar13 = 0;
      lVar10 = 0;
      sVar4 = testcase.assoc_data_len;
      while (sVar4 != 0) {
        uVar13 = uVar13 + 1;
        if (sVar4 < uVar13) {
          uVar13 = sVar4;
        }
        ascon_aead128a_assoc_data_update
                  ((ascon_aead_ctx_t *)obtained_ciphertext_4,testcase.assoc_data + lVar10,uVar13);
        lVar10 = lVar10 + uVar13;
        sVar4 = sVar4 - uVar13;
        if (((uint)lVar10 & 0xf) != (uint)local_50) {
          uVar8 = 0x24c;
          goto LAB_00110660;
        }
      }
      lVar10 = 0;
      uVar13 = 0;
      lVar11 = 0;
      for (sVar4 = testcase.plaintext_len; sVar4 != 0; sVar4 = sVar4 - uVar13) {
        uVar13 = uVar13 + 1;
        if (sVar4 < uVar13) {
          uVar13 = sVar4;
        }
        sVar6 = ascon_aead128a_encrypt_update
                          ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag + lVar10,
                           testcase.plaintext + lVar11,uVar13);
        lVar11 = lVar11 + uVar13;
        if (((uint)lVar11 & 0xf) != (uint)local_50) {
          uVar8 = 0x25e;
          goto LAB_00110660;
        }
        lVar10 = lVar10 + sVar6;
      }
      sVar4 = ascon_aead128a_encrypt_final
                        ((ascon_aead_ctx_t *)obtained_ciphertext_4,obtained_tag + lVar10,
                         obtained_tag_3,0x10);
      if (0xf < sVar4) {
        uVar8 = 0x267;
        goto LAB_00110660;
      }
      if (sVar4 != ((uint)testcase.ciphertext_len & 0xf)) {
        uVar8 = 0x268;
        goto LAB_00110660;
      }
      if (sVar4 + lVar10 != testcase.ciphertext_len) {
        uVar8 = 0x269;
        goto LAB_00110660;
      }
      vecs_aead_enc_log(&testcase,obtained_tag,obtained_tag_3,sVar4 + lVar10);
      iVar2 = bcmp(obtained_tag,testcase.ciphertext,testcase.ciphertext_len);
      if (iVar2 != 0) {
        uVar8 = 0x26e;
        goto LAB_00110660;
      }
      if (obtained_tag_3 != testcase.tag) {
        uVar8 = 0x26f;
        goto LAB_00110660;
      }
      lVar10 = 0;
      while (lVar10 != 0x58) {
        puVar12 = obtained_ciphertext_4 + lVar10;
        lVar10 = lVar10 + 1;
        if (*puVar12 != '\0') {
          uVar8 = 0x270;
          goto LAB_00110660;
        }
      }
    }
  }
  else {
    uVar8 = 0x22f;
LAB_00110660:
    printf("FAIL | File: %s:%d | Test case: %s | Ctr: %llu\n",
           "/workspace/llm4binary/github/license_all_cmakelists_1510/TheMatjaz[P]LibAscon/tst/test_aead128a_enc.c"
           ,uVar8,"test_encrypt_update_var_bytes",atto_counter);
    atto_at_least_one_fail = '\x01';
  }
  return;
}

Assistant:

void test_aead128a_encryption(void)
{
    puts("Testing Ascon-128a encryption...");
    test_aead_cleanup();
    test_encrypt_empty();
    test_encrypt_1_byte_ad_empty_pt();
    test_encrypt_1_byte_pt_empty_ad();
    test_encrypt_1_byte_pt_1_byte_ad();
    test_encrypt_offline();
    test_encrypt_update_single_byte();
    test_encrypt_update_three_bytes();
    test_encrypt_update_var_bytes();
}